

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_unique_ptr.cpp
# Opt level: O1

void __thiscall TestA::~TestA(TestA *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"~TestA()",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  this_00 = (this->m_TestB_Ptr).super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

~TestA()
	{
		std::cout << "~TestA()" << std::endl;
	}